

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnTableCopy(SharedValidator *this,Location *loc,Var *dst_var,Var *src_var)

{
  Result RVar1;
  Var local_110;
  Enum local_c4;
  Var local_c0;
  Enum local_74;
  undefined1 local_70 [8];
  TableType src_table;
  TableType dst_table;
  Var *src_var_local;
  Var *dst_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = loc;
  TableType::TableType((TableType *)&src_table.limits.has_max);
  TableType::TableType((TableType *)local_70);
  Var::Var(&local_c0,dst_var);
  local_74 = (Enum)CheckTableIndex(this,&local_c0,(TableType *)&src_table.limits.has_max);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_74);
  Var::~Var(&local_c0);
  Var::Var(&local_110,src_var);
  local_c4 = (Enum)CheckTableIndex(this,&local_110,(TableType *)local_70);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_c4);
  Var::~Var(&local_110);
  RVar1 = TypeChecker::OnTableCopy(&this->typechecker_);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = CheckType(this,loc,(Type)local_70._0_4_,(Type)src_table.limits._16_4_,"table.copy");
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnTableCopy(const Location& loc,
                                    Var dst_var,
                                    Var src_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  TableType dst_table;
  TableType src_table;
  result |= CheckTableIndex(dst_var, &dst_table);
  result |= CheckTableIndex(src_var, &src_table);
  result |= typechecker_.OnTableCopy();
  result |= CheckType(loc, src_table.element, dst_table.element, "table.copy");
  return result;
}